

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsSetUploadSize(Curl_easy *data,curl_off_t size)

{
  curl_off_t size_local;
  Curl_easy *data_local;
  
  if (size < 0) {
    (data->progress).ul.total_size = 0;
    (data->progress).flags = (data->progress).flags & 0xffffffdf;
  }
  else {
    (data->progress).ul.total_size = size;
    (data->progress).flags = (data->progress).flags | 0x20;
  }
  return;
}

Assistant:

void Curl_pgrsSetUploadSize(struct Curl_easy *data, curl_off_t size)
{
  if(size >= 0) {
    data->progress.ul.total_size = size;
    data->progress.flags |= PGRS_UL_SIZE_KNOWN;
  }
  else {
    data->progress.ul.total_size = 0;
    data->progress.flags &= ~PGRS_UL_SIZE_KNOWN;
  }
}